

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tspm.cpp
# Opt level: O1

bool __thiscall pg::TSPMSolver::lift(TSPMSolver *this,int node,int target)

{
  int *pm;
  int d;
  int iVar1;
  Game *pGVar2;
  ulong uVar3;
  long lVar4;
  int *piVar5;
  int *piVar6;
  char cVar7;
  uint pl;
  ulong uVar8;
  ostream *poVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  char *pcVar15;
  long lVar16;
  int *piVar17;
  int to;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  bool bVar21;
  bool bVar22;
  uint local_84;
  uint local_80;
  uint local_7c;
  
  uVar14 = (ulong)node;
  pm = this->pms + this->k * uVar14;
  if ((*pm != -1) || (pm[1] != -1)) {
    this->lift_attempt = this->lift_attempt + 1;
    pGVar2 = (this->super_Solver).game;
    uVar10 = uVar14 >> 6;
    uVar3 = (pGVar2->_owner)._bits[uVar10];
    uVar20 = 1L << (uVar14 & 0x3f);
    bVar21 = (uVar3 & uVar20) == 0;
    pl = (uint)bVar21;
    bVar21 = !bVar21;
    d = pGVar2->_priority[uVar14];
    uVar8 = (ulong)d;
    if (1 < (this->super_Solver).trace) {
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1mupdating node ",0x12);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,node);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
      poVar9 = (ostream *)std::ostream::operator<<(poVar9,d);
      bVar22 = ((((this->super_Solver).game)->_owner)._bits[uVar10] & uVar20) == 0;
      pcVar15 = " (odd)";
      if (bVar22) {
        pcVar15 = " (even)";
      }
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,(ulong)bVar22 | 6);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"\x1b[m with current progress measure",0x21);
      pm_stream(this,(this->super_Solver).logger,pm);
      poVar9 = (this->super_Solver).logger;
      cVar7 = (char)poVar9;
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
      std::ostream::put(cVar7);
      std::ostream::flush();
    }
    uVar13 = (ulong)((uVar3 & uVar20) != 0);
    uVar12 = (ulong)pl;
    if (pm[uVar13] == -1) {
      local_7c = 0xffffffff;
      local_80 = 0xffffffff;
    }
    else {
      local_7c = 0xffffffff;
      if (1 < (this->super_Solver).trace) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"computing max",0xd);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        lVar4 = this->k;
        if ((long)uVar12 < lVar4) {
          piVar17 = this->tmp;
          uVar11 = uVar12;
          do {
            piVar17[uVar11] = pm[uVar11];
            uVar11 = uVar11 + 2;
          } while ((long)uVar11 < lVar4);
        }
      }
      if (target == -1) {
        pGVar2 = (this->super_Solver).game;
        piVar17 = pGVar2->_outedges;
        iVar1 = pGVar2->_firstouts[uVar14];
        uVar18 = piVar17[iVar1];
        local_80 = 0xffffffff;
        if (uVar18 != 0xffffffff) {
          piVar17 = piVar17 + iVar1;
          local_80 = 0xffffffff;
          local_7c = 0xffffffff;
          do {
            local_84 = (uint)bVar21;
            uVar11 = (ulong)(int)uVar18;
            uVar19 = local_7c;
            if ((((this->super_Solver).disabled)->_bits[uVar11 >> 6] >> (uVar11 & 0x3f) & 1) == 0) {
              Prog(this,this->tmp,this->pms + this->k * uVar11,d,(uint)bVar21);
              if (1 < (this->super_Solver).trace) {
                poVar9 = (this->super_Solver).logger;
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"successor node ",0xf);
                poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar18);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
                poVar9 = (ostream *)
                         std::ostream::operator<<
                                   (poVar9,((this->super_Solver).game)->_priority[uVar11]);
                std::__ostream_insert<char,std::char_traits<char>>(poVar9," results in",0xb);
                pm_stream(this,(this->super_Solver).logger,this->tmp);
                poVar9 = (this->super_Solver).logger;
                cVar7 = (char)poVar9;
                std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
                std::ostream::put(cVar7);
                std::ostream::flush();
              }
              piVar5 = this->tmp;
              bVar22 = pm_less(this,pm,piVar5,d,local_84);
              if (bVar22) {
                lVar4 = this->k;
                for (uVar11 = uVar13; (long)uVar11 < lVar4; uVar11 = uVar11 + 2) {
                  pm[uVar11] = piVar5[uVar11];
                }
                uVar19 = uVar18;
                if ((uVar20 & uVar3) == 0) {
                  local_80 = uVar18;
                  uVar19 = local_7c;
                }
              }
            }
            local_7c = uVar19;
            uVar18 = piVar17[1];
            piVar17 = piVar17 + 1;
          } while (uVar18 != 0xffffffff);
        }
      }
      else {
        Prog(this,this->tmp,this->pms + this->k * (long)target,d,(uint)bVar21);
        if (1 < (this->super_Solver).trace) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"successor node ",0xf);
          poVar9 = (ostream *)std::ostream::operator<<(poVar9,target);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
          poVar9 = (ostream *)
                   std::ostream::operator<<(poVar9,((this->super_Solver).game)->_priority[target]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9," results in",0xb);
          pm_stream(this,(this->super_Solver).logger,this->tmp);
          poVar9 = (this->super_Solver).logger;
          cVar7 = (char)poVar9;
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
          std::ostream::put(cVar7);
          std::ostream::flush();
        }
        piVar17 = this->tmp;
        bVar21 = pm_less(this,pm,piVar17,d,(uint)bVar21);
        local_80 = 0xffffffff;
        if (bVar21) {
          lVar4 = this->k;
          for (uVar11 = uVar13; (long)uVar11 < lVar4; uVar11 = uVar11 + 2) {
            pm[uVar11] = piVar17[uVar11];
          }
          local_7c = -(uint)((uVar3 & uVar20) == 0) | target;
          local_80 = -(uint)((uVar3 & uVar20) != 0) | target;
        }
      }
    }
    uVar18 = local_7c;
    if ((pm[uVar12] != -1) && ((target == -1 || (this->strategy[uVar14] == target)))) {
      if (1 < (this->super_Solver).trace) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"computing min",0xd);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      if ((1 < (this->super_Solver).trace) && (lVar4 = this->k, (long)uVar13 < lVar4)) {
        piVar17 = this->tmp;
        do {
          piVar17[uVar13] = pm[uVar13];
          uVar13 = uVar13 + 2;
        } while ((long)uVar13 < lVar4);
      }
      pGVar2 = (this->super_Solver).game;
      piVar17 = pGVar2->_outedges;
      iVar1 = pGVar2->_firstouts[uVar14];
      uVar19 = piVar17[iVar1];
      if (uVar19 == 0xffffffff) {
        local_84 = 0xffffffff;
      }
      else {
        piVar17 = piVar17 + iVar1;
        local_84 = 0xffffffff;
        do {
          uVar13 = (ulong)(int)uVar19;
          if ((((this->super_Solver).disabled)->_bits[uVar13 >> 6] >> (uVar13 & 0x3f) & 1) == 0) {
            Prog(this,this->tmp,this->pms + this->k * uVar13,d,pl);
            if (1 < (this->super_Solver).trace) {
              poVar9 = (this->super_Solver).logger;
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"successor node ",0xf);
              poVar9 = (ostream *)std::ostream::operator<<(poVar9,uVar19);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
              poVar9 = (ostream *)
                       std::ostream::operator<<
                                 (poVar9,((this->super_Solver).game)->_priority[uVar13]);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," results in",0xb);
              pm_stream(this,(this->super_Solver).logger,this->tmp);
              poVar9 = (this->super_Solver).logger;
              cVar7 = (char)poVar9;
              std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
              std::ostream::put(cVar7);
              std::ostream::flush();
            }
            if (((local_84 == 0xffffffff) ||
                (bVar21 = pm_less(this,this->tmp,this->best,d,pl), bVar21)) &&
               (lVar4 = this->k, local_84 = uVar19, 0 < lVar4)) {
              piVar5 = this->tmp;
              piVar6 = this->best;
              lVar16 = 0;
              do {
                piVar6[lVar16] = piVar5[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar4 != lVar16);
            }
          }
          uVar19 = piVar17[1];
          piVar17 = piVar17 + 1;
        } while (uVar19 != 0xffffffff);
      }
      this->strategy[uVar14] = local_84;
      piVar17 = this->best;
      bVar21 = pm_less(this,pm,piVar17,d,pl);
      if (bVar21) {
        lVar4 = this->k;
        for (; (long)uVar12 < lVar4; uVar12 = uVar12 + 2) {
          pm[uVar12] = piVar17[uVar12];
        }
        uVar18 = local_84;
        if ((uVar3 & uVar20) != 0) {
          local_80 = local_84;
          uVar18 = local_7c;
        }
      }
    }
    if ((local_80 != 0xffffffff) || (uVar18 != 0xffffffff)) {
      if ((this->super_Solver).trace != 0) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[1;32mupdated node ",0x14);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,node);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"/",1);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,d);
        bVar21 = ((((this->super_Solver).game)->_owner)._bits[uVar10] & uVar20) == 0;
        pcVar15 = " (odd)";
        if (bVar21) {
          pcVar15 = " (even)";
        }
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,pcVar15,(ulong)bVar21 | 6);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m to",6);
        pm_stream(this,(this->super_Solver).logger,pm);
        poVar9 = (this->super_Solver).logger;
        cVar7 = (char)poVar9;
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + cVar7);
        std::ostream::put(cVar7);
        std::ostream::flush();
      }
      if (((local_80 != 0xffffffff) && ((uVar8 & 1) == 0)) && (*pm == -1)) {
        this->counts[uVar8] = this->counts[uVar8] + -1;
      }
      if (((uVar18 != 0xffffffff) && ((uVar8 & 1) != 0)) && (pm[1] == -1)) {
        this->counts[uVar8] = this->counts[uVar8] + -1;
      }
      this->lift_count = this->lift_count + 1;
      return true;
    }
  }
  return false;
}

Assistant:

bool
TSPMSolver::lift(int node, int target)
{
    // obtain ptr to current progress measure
    int *pm = pms + k*node;

    // check if already Top for both players
    if (pm[0] == -1 and pm[1] == -1) return false;

    lift_attempt++;

    // initialize stuff
    const int pl_max = owner(node);
    const int pl_min = 1 - pl_max;
    const int d = priority(node);

#ifndef NDEBUG
    if (trace >= 2) {
        logger << "\033[1mupdating node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m with current progress measure";
        pm_stream(logger, pm);
        logger << std::endl;
    }
#endif

    int best_ch0 = -1, best_ch1 = -1;

    // do max for player <pl_max>
    if (pm[pl_max] != -1) {
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "computing max" << std::endl;
            pm_copy(tmp, pm, 1-pl_max);
        }
#endif
        if (target != -1) {
            // just look at target
            Prog(tmp, pms + k*target, d, pl_max);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "successor node " << target << "/" << priority(target) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }
#endif
            if (pm_less(pm, tmp, d, pl_max)) {
                pm_copy(pm, tmp, pl_max);
                if (pl_max) best_ch1 = target;
                else best_ch0 = target;
            }
        } else {
            for (auto curedge = outs(node); *curedge != -1; curedge++) {
                int to = *curedge;
                if (disabled[to]) continue;
                Prog(tmp, pms + k*to, d, pl_max);
#ifndef NDEBUG
                if (trace >= 2) {
                    logger << "successor node " << to << "/" << priority(to) << " results in";
                    pm_stream(logger, tmp);
                    logger << std::endl;
                }
#endif
                if (pm_less(pm, tmp, d, pl_max)) {
                    pm_copy(pm, tmp, pl_max);
                    if (pl_max) best_ch1 = to;
                    else best_ch0 = to;
                }
            }
        }
    }

    // do min for player <pl_min>
    if (pm[pl_min] != -1 and (target == -1 or target == strategy[node])) {
#ifndef NDEBUG
        if (trace >= 2) logger << "computing min" << std::endl;
        if (trace >= 2) pm_copy(tmp, pm, 1-pl_min);
#endif
        int best_to = -1;
        for (auto curedge = outs(node); *curedge != -1; curedge++) {
            int to = *curedge;
            if (disabled[to]) continue;
            Prog(tmp, pms + k*to, d, pl_min);
#ifndef NDEBUG
            if (trace >= 2) {
                logger << "successor node " << to << "/" << priority(to) << " results in";
                pm_stream(logger, tmp);
                logger << std::endl;
            }
#endif
            if (best_to == -1 or pm_less(tmp, best, d, pl_min)) {
                for (int i=0; i<k; i++) best[i] = tmp[i];
                best_to = to;
            }
        }

        strategy[node] = best_to;
        // note: sometimes only the strategy changes, but the lowest pm stays the same
        // now "best" contains the smallest Prog, which may be higher than the current min
        if (pm_less(pm, best, d, pl_min)) {
            pm_copy(pm, best, pl_min);
            if (pl_min) best_ch1 = best_to;
            else best_ch0 = best_to;
        }
    }

    bool ch0 = best_ch0 != -1;
    bool ch1 = best_ch1 != -1;

    if (ch0 or ch1) {
        if (trace) {
            logger << "\033[1;32mupdated node " << node << "/" << d << (owner(node)?" (odd)":" (even)") << "\033[m to";
            pm_stream(logger, pm);
            logger << std::endl;
        }
        // update counts if a changed pm is now Top, but only if priority has same parity as winner
        if (ch0 and pm[0] == -1 and (d&1) == 0) counts[d]--;
        if (ch1 and pm[1] == -1 and (d&1) == 1) counts[d]--;
        // increase count and return true
        lift_count++;
        return true;
    } else {
        return false;
    }
}